

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O1

uint8_t SrgbTransform::linearToSrgb8bit(float x)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  if (x <= 0.0) {
    return '\0';
  }
  uVar1 = 0xff;
  if (x < 1.0) {
    iVar2 = 0;
    uVar4 = 0x80;
    do {
      if (*(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)(int)(uVar4 + iVar2) * 4) <= x) {
        iVar2 = uVar4 + iVar2;
      }
      bVar5 = 1 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar5);
    if (x - *(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)iVar2 * 4) <=
        *(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)iVar2 * 4 + 4) - x) {
      iVar3 = 0xff;
      if (iVar2 < 0xff) {
        iVar3 = iVar2;
      }
      uVar1 = '\0';
      if (0 < iVar3) {
        uVar1 = (uint8_t)iVar3;
      }
      return uVar1;
    }
    iVar3 = -1;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    uVar1 = 0xff;
    if (iVar2 < 0xfe) {
      uVar1 = (char)iVar3 + '\x01';
    }
  }
  return uVar1;
}

Assistant:

uint8_t linearToSrgb8bit(float x) {
	if (x <= 0.0f)
		return 0;
	if (x >= 1.0f)
		return 255;
	const float *TABLE = SRGB_8BIT_TO_LINEAR_FLOAT;
	int y = 0;
	for (int i = 128; i != 0; i >>= 1) {
		if (TABLE[y + i] <= x)
			y += i;
	}
	if (x - TABLE[y] <= TABLE[y + 1] - x)
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y)));
	else
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y + 1)));
}